

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmLocalUnixMakefileGenerator3::WriteLocalMakefile(cmLocalUnixMakefileGenerator3 *this)

{
  _Rb_tree_node_base *output;
  _Rb_tree_node_base *info;
  bool bVar1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  bool bVar4;
  bool bVar5;
  Encoding encoding;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  _Base_ptr *__lhs;
  LocalObjectEntry *entry;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar8;
  string base;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>_>
  localObjectFiles;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emittedTargets;
  string ruleFileNameFull;
  string ruleFileName;
  cmGeneratedFileStream ruleFileStream;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ruleFileName,"Makefile",(allocator<char> *)&ruleFileStream);
  ConvertToFullPath(&ruleFileNameFull,this,&ruleFileName);
  encoding = (*((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
               _vptr_cmGlobalGenerator[5])();
  cmGeneratedFileStream::cmGeneratedFileStream(&ruleFileStream,&ruleFileNameFull,false,encoding);
  if (((&ruleFileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20
       )[(long)ruleFileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
               _vptr_basic_ostream[-3]] & 5) == 0) {
    bVar4 = cmLocalGenerator::IsRootMakefile((cmLocalGenerator *)this);
    if (!bVar4) {
      cmGeneratedFileStream::SetCopyIfDifferent(&ruleFileStream,true);
    }
    WriteLocalAllRules(this,(ostream *)&ruleFileStream);
    emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header;
    emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    emittedTargets._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    bVar4 = cmLocalGenerator::IsRootMakefile((cmLocalGenerator *)this);
    if (bVar4) {
      cmGlobalUnixMakefileGenerator3::WriteConvenienceRules
                ((cmGlobalUnixMakefileGenerator3 *)
                 (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator,
                 (ostream *)&ruleFileStream,&emittedTargets);
    }
    else {
      WriteLocalMakefileTargets(this,(ostream *)&ruleFileStream,&emittedTargets);
    }
    bVar4 = this->SkipPreprocessedSourceRules;
    bVar1 = this->SkipAssemblySourceRules;
    localObjectFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &localObjectFiles._M_t._M_impl.super__Rb_tree_header._M_header;
    localObjectFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    localObjectFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    localObjectFiles._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    localObjectFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         localObjectFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    GetLocalObjectFiles(this,&localObjectFiles);
    for (p_Var6 = localObjectFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 != &localObjectFiles._M_t._M_impl.super__Rb_tree_header;
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
      output = p_Var6 + 1;
      info = p_Var6 + 2;
      WriteObjectConvenienceRule
                (this,(ostream *)&ruleFileStream,"target to build an object file",(string *)output,
                 (LocalObjectInfo *)info);
      p_Var2 = p_Var6[2]._M_parent;
      p_Var3 = *(_Base_ptr *)(p_Var6 + 2);
      do {
        p_Var7 = p_Var3;
        if (p_Var7 == p_Var2) goto LAB_00313416;
        __lhs = &p_Var7->_M_parent;
        bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__lhs,"C");
        if (bVar5) break;
        bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__lhs,"CXX");
        if (bVar5) break;
        bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__lhs,"CUDA");
        if (bVar5) break;
        bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__lhs,"Fortran");
        p_Var3 = (_Base_ptr)&p_Var7[1]._M_parent;
      } while (!bVar5);
      if ((p_Var7 != p_Var2) && (bVar4 == false)) {
        std::__cxx11::string::rfind((char *)output,0x476b89);
        std::__cxx11::string::substr((ulong)&base,(ulong)output);
        std::operator+(&local_338,&base,".i");
        WriteObjectConvenienceRule
                  (this,(ostream *)&ruleFileStream,"target to preprocess a source file",&local_338,
                   (LocalObjectInfo *)info);
        std::__cxx11::string::~string((string *)&local_338);
        *(undefined1 *)((long)&p_Var6[2]._M_right + 1) = 1;
        std::__cxx11::string::~string((string *)&base);
      }
      if ((p_Var7 != p_Var2) && (bVar1 == false)) {
        std::__cxx11::string::rfind((char *)output,0x476b89);
        std::__cxx11::string::substr((ulong)&base,(ulong)output);
        std::operator+(&local_338,&base,".s");
        WriteObjectConvenienceRule
                  (this,(ostream *)&ruleFileStream,"target to generate assembly for a file",
                   &local_338,(LocalObjectInfo *)info);
        std::__cxx11::string::~string((string *)&local_338);
        *(undefined1 *)((long)&p_Var6[2]._M_right + 2) = 1;
        std::__cxx11::string::~string((string *)&base);
      }
LAB_00313416:
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&base,"help",(allocator<char> *)&local_338);
    pVar8 = std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&emittedTargets,&base);
    std::__cxx11::string::~string((string *)&base);
    if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      cmGlobalUnixMakefileGenerator3::WriteHelpRule
                ((cmGlobalUnixMakefileGenerator3 *)
                 (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator,
                 (ostream *)&ruleFileStream,this);
    }
    WriteSpecialTargetsBottom(this,(ostream *)&ruleFileStream);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>_>
    ::~_Rb_tree(&localObjectFiles._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&emittedTargets._M_t);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream(&ruleFileStream);
  std::__cxx11::string::~string((string *)&ruleFileNameFull);
  std::__cxx11::string::~string((string *)&ruleFileName);
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::WriteLocalMakefile()
{
  // generate the includes
  std::string ruleFileName = "Makefile";

  // Open the rule file.  This should be copy-if-different because the
  // rules may depend on this file itself.
  std::string ruleFileNameFull = this->ConvertToFullPath(ruleFileName);
  cmGeneratedFileStream ruleFileStream(
    ruleFileNameFull, false, this->GlobalGenerator->GetMakefileEncoding());
  if (!ruleFileStream) {
    return;
  }
  // always write the top makefile
  if (!this->IsRootMakefile()) {
    ruleFileStream.SetCopyIfDifferent(true);
  }

  // write the all rules
  this->WriteLocalAllRules(ruleFileStream);

  // only write local targets unless at the top Keep track of targets already
  // listed.
  std::set<std::string> emittedTargets;
  if (!this->IsRootMakefile()) {
    // write our targets, and while doing it collect up the object
    // file rules
    this->WriteLocalMakefileTargets(ruleFileStream, emittedTargets);
  } else {
    cmGlobalUnixMakefileGenerator3* gg =
      static_cast<cmGlobalUnixMakefileGenerator3*>(this->GlobalGenerator);
    gg->WriteConvenienceRules(ruleFileStream, emittedTargets);
  }

  bool do_preprocess_rules = this->GetCreatePreprocessedSourceRules();
  bool do_assembly_rules = this->GetCreateAssemblySourceRules();

  std::map<std::string, LocalObjectInfo> localObjectFiles;
  this->GetLocalObjectFiles(localObjectFiles);

  // now write out the object rules
  // for each object file name
  for (auto& localObjectFile : localObjectFiles) {
    // Add a convenience rule for building the object file.
    this->WriteObjectConvenienceRule(
      ruleFileStream, "target to build an object file", localObjectFile.first,
      localObjectFile.second);

    // Check whether preprocessing and assembly rules make sense.
    // They make sense only for C and C++ sources.
    bool lang_has_preprocessor = false;
    bool lang_has_assembly = false;

    for (LocalObjectEntry const& entry : localObjectFile.second) {
      if (entry.Language == "C" || entry.Language == "CXX" ||
          entry.Language == "CUDA" || entry.Language == "Fortran") {
        // Right now, C, C++, Fortran and CUDA have both a preprocessor and the
        // ability to generate assembly code
        lang_has_preprocessor = true;
        lang_has_assembly = true;
        break;
      }
    }

    // Add convenience rules for preprocessed and assembly files.
    if (lang_has_preprocessor && do_preprocess_rules) {
      std::string::size_type dot_pos = localObjectFile.first.rfind(".");
      std::string base = localObjectFile.first.substr(0, dot_pos);
      this->WriteObjectConvenienceRule(ruleFileStream,
                                       "target to preprocess a source file",
                                       (base + ".i"), localObjectFile.second);
      localObjectFile.second.HasPreprocessRule = true;
    }

    if (lang_has_assembly && do_assembly_rules) {
      std::string::size_type dot_pos = localObjectFile.first.rfind(".");
      std::string base = localObjectFile.first.substr(0, dot_pos);
      this->WriteObjectConvenienceRule(
        ruleFileStream, "target to generate assembly for a file",
        (base + ".s"), localObjectFile.second);
      localObjectFile.second.HasAssembleRule = true;
    }
  }

  // add a help target as long as there isn;t a real target named help
  if (emittedTargets.insert("help").second) {
    cmGlobalUnixMakefileGenerator3* gg =
      static_cast<cmGlobalUnixMakefileGenerator3*>(this->GlobalGenerator);
    gg->WriteHelpRule(ruleFileStream, this);
  }

  this->WriteSpecialTargetsBottom(ruleFileStream);
}